

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metainfo.c
# Opt level: O0

int ndn_metainfo_tlv_encode(ndn_encoder_t *encoder,ndn_metainfo_t *meta)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  uint32_t local_2c;
  uint32_t local_28;
  uint32_t comp_tlv_size;
  uint32_t meta_value_size;
  int ret_val;
  ndn_metainfo_t *meta_local;
  ndn_encoder_t *encoder_local;
  
  local_28 = 0;
  local_2c = 0;
  if (meta->enable_ContentType != '\0') {
    local_28 = encoder_probe_block_size(0x18,1);
  }
  if (meta->enable_FreshnessPeriod != '\0') {
    uVar1 = encoder_probe_uint_length(meta->freshness_period);
    uVar1 = encoder_probe_block_size(0x19,uVar1);
    local_28 = uVar1 + local_28;
  }
  if (meta->enable_FinalBlockId != '\0') {
    local_2c = name_component_probe_block_size(&meta->final_block_id);
    uVar1 = encoder_probe_block_size(0x1a,local_2c);
    local_28 = uVar1 + local_28;
  }
  if (local_28 == 0) {
    encoder_local._4_4_ = 0;
  }
  else {
    uVar1 = encoder->offset;
    uVar2 = encoder_probe_block_size(0x14,local_28);
    if (encoder->output_max_size < uVar1 + uVar2) {
      encoder_local._4_4_ = -10;
    }
    else {
      encoder_local._4_4_ = encoder_append_type(encoder,0x14);
      if (((encoder_local._4_4_ == 0) &&
          (encoder_local._4_4_ = encoder_append_length(encoder,local_28), encoder_local._4_4_ == 0))
         && ((meta->enable_ContentType == '\0' ||
             (((encoder_local._4_4_ = encoder_append_type(encoder,0x18), encoder_local._4_4_ == 0 &&
               (encoder_local._4_4_ = encoder_append_length(encoder,1), encoder_local._4_4_ == 0))
              && (encoder_local._4_4_ = encoder_append_byte_value(encoder,meta->content_type),
                 encoder_local._4_4_ == 0)))))) {
        if (meta->enable_FreshnessPeriod != '\0') {
          iVar3 = encoder_append_type(encoder,0x19);
          if (iVar3 != 0) {
            return iVar3;
          }
          uVar1 = encoder_probe_uint_length(meta->freshness_period);
          iVar3 = encoder_append_length(encoder,uVar1);
          if (iVar3 != 0) {
            return iVar3;
          }
          iVar3 = encoder_append_uint_value(encoder,meta->freshness_period);
          if (iVar3 != 0) {
            return iVar3;
          }
        }
        if ((meta->enable_FinalBlockId == '\0') ||
           (((encoder_local._4_4_ = encoder_append_type(encoder,0x1a), encoder_local._4_4_ == 0 &&
             (encoder_local._4_4_ = encoder_append_length(encoder,local_2c),
             encoder_local._4_4_ == 0)) &&
            (encoder_local._4_4_ = name_component_tlv_encode(encoder,&meta->final_block_id),
            encoder_local._4_4_ == 0)))) {
          encoder_local._4_4_ = 0;
        }
      }
    }
  }
  return encoder_local._4_4_;
}

Assistant:

int
ndn_metainfo_tlv_encode(ndn_encoder_t* encoder, const ndn_metainfo_t* meta)
{

  int ret_val = -1;
  
  uint32_t meta_value_size = 0;
  uint32_t comp_tlv_size = 0;
  if (meta->enable_ContentType) {
    meta_value_size += encoder_probe_block_size(TLV_ContentType, 1);
  }
  if (meta->enable_FreshnessPeriod) {
    meta_value_size += encoder_probe_block_size(TLV_FreshnessPeriod, 
                                                encoder_probe_uint_length(meta->freshness_period));
  }
  if (meta->enable_FinalBlockId) {
    comp_tlv_size = name_component_probe_block_size(&meta->final_block_id);
    meta_value_size += encoder_probe_block_size(TLV_FinalBlockId, comp_tlv_size);
  }

  if (meta_value_size == 0)
    return 0;

  if (encoder->offset + encoder_probe_block_size(TLV_MetaInfo, meta_value_size)
      > encoder->output_max_size)
    return NDN_OVERSIZE;

  ret_val = encoder_append_type(encoder, TLV_MetaInfo);
  if (ret_val != NDN_SUCCESS) return ret_val;
  ret_val = encoder_append_length(encoder, meta_value_size);
  if (ret_val != NDN_SUCCESS) return ret_val;

  if (meta->enable_ContentType) {
    ret_val = encoder_append_type(encoder, TLV_ContentType);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(encoder, 1);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_byte_value(encoder, meta->content_type);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }
  if (meta->enable_FreshnessPeriod) {
    ret_val = encoder_append_type(encoder, TLV_FreshnessPeriod);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(encoder, encoder_probe_uint_length(meta->freshness_period));
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_uint_value(encoder, meta->freshness_period);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }
  if (meta->enable_FinalBlockId) {
    ret_val = encoder_append_type(encoder, TLV_FinalBlockId);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(encoder, comp_tlv_size);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = name_component_tlv_encode(encoder, &meta->final_block_id);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }
  return 0;
}